

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::LocalClient::whenMoreResolved(LocalClient *this)

{
  ClientHook *pCVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar2;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar3;
  ForkedPromise<void> local_70;
  ForkedPromise<void> *local_60;
  ForkedPromise<void> *t;
  ForkedPromise<void> *_t671;
  FixVoid<kj::Own<capnp::ClientHook>_> local_40;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_30;
  Own<capnp::ClientHook,_std::nullptr_t> *local_28;
  Own<capnp::ClientHook,_std::nullptr_t> *r;
  Own<capnp::ClientHook,_std::nullptr_t> *_r669;
  LocalClient *this_local;
  
  this_local = this;
  local_28 = kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>
                       ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)(in_RSI + 0x58));
  r = local_28;
  if (local_28 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
    local_60 = kj::_::readMaybe<kj::ForkedPromise<void>>
                         ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x40));
    t = local_60;
    if (local_60 == (ForkedPromise<void> *)0x0) {
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
                ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this);
      aVar2 = extraout_RDX_01;
    }
    else {
      kj::ForkedPromise<void>::addBranch(&local_70);
      kj::Promise<void>::then<capnp::LocalClient::whenMoreResolved()::_lambda()_1_>
                ((Promise<void> *)&local_70.hub.ptr,(Type *)&local_70);
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
                ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this,
                 (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_70.hub.ptr);
      kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise
                ((Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_70.hub.ptr);
      kj::Promise<void>::~Promise((Promise<void> *)&local_70);
      aVar2 = extraout_RDX_00;
    }
  }
  else {
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(local_28);
    (*pCVar1->_vptr_ClientHook[4])();
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Promise(&local_30,&local_40);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this,&local_30);
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(&local_30);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_40);
    aVar2 = extraout_RDX;
  }
  MVar3.ptr.field_1 = aVar2;
  MVar3.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->addRef());
    } else KJ_IF_SOME(t, resolveTask) {
      return t.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(resolved)->addRef();
      });
    } else {
      return kj::none;
    }